

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O3

void __thiscall QRhiGles2::releaseCachedResources(QRhiGles2 *this)

{
  ulong uVar1;
  bool bVar2;
  Data<QHashPrivate::Node<QRhiShaderStage,_unsigned_int>_> *d;
  ulong uVar3;
  
  bVar2 = ensureContext(this,(QSurface *)0x0);
  if (!bVar2) {
    return;
  }
  d = (this->m_shaderCache).d;
  if (d == (Data<QHashPrivate::Node<QRhiShaderStage,_unsigned_int>_> *)0x0) {
    d = (Data<QHashPrivate::Node<QRhiShaderStage,_unsigned_int>_> *)0x0;
    uVar3 = 0;
LAB_00564597:
    if (d == (Data<QHashPrivate::Node<QRhiShaderStage,_unsigned_int>_> *)0x0 && uVar3 == 0)
    goto LAB_00564623;
  }
  else {
    if (1 < (uint)(d->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      d = QHashPrivate::Data<QHashPrivate::Node<QRhiShaderStage,_unsigned_int>_>::detached(d);
      (this->m_shaderCache).d = d;
    }
    if (d->spans->offsets[0] == 0xff) {
      uVar1 = 1;
      do {
        uVar3 = uVar1;
        if (d->numBuckets == uVar3) {
          d = (Data<QHashPrivate::Node<QRhiShaderStage,_unsigned_int>_> *)0x0;
          uVar3 = 0;
          break;
        }
        uVar1 = uVar3 + 1;
      } while (d->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] == 0xff);
      goto LAB_00564597;
    }
    uVar3 = 0;
  }
  do {
    (*(((this->f->super_QOpenGLExtraFunctions).super_QOpenGLFunctions.d_ptr)->field_0).functions
      [0x45])((ulong)*(uint *)(d->spans[uVar3 >> 7].entries
                               [d->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f]].storage.data +
                              0x18));
    do {
      if (d->numBuckets - 1 == uVar3) {
        d = (Data<QHashPrivate::Node<QRhiShaderStage,_unsigned_int>_> *)0x0;
        uVar3 = 0;
        break;
      }
      uVar3 = uVar3 + 1;
    } while (d->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] == 0xff);
  } while ((d != (Data<QHashPrivate::Node<QRhiShaderStage,_unsigned_int>_> *)0x0) || (uVar3 != 0));
LAB_00564623:
  QHash<QRhiShaderStage,_unsigned_int>::clear(&this->m_shaderCache);
  QHash<QByteArray,_QRhiGles2::PipelineCacheData>::clear(&this->m_pipelineCache);
  return;
}

Assistant:

void QRhiGles2::releaseCachedResources()
{
    if (!ensureContext())
        return;

    for (uint shader : m_shaderCache)
        f->glDeleteShader(shader);

    m_shaderCache.clear();

    m_pipelineCache.clear();
}